

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86::forward_inplace(BinaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int *p_Var1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  __m128 *pafVar6;
  int iVar7;
  undefined1 (*pauVar8) [16];
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  undefined4 extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM3 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  __m128 afVar25;
  binary_op_pow op;
  __m128 _b;
  binary_op_pow local_91;
  Mat *local_90;
  long local_88;
  long local_80;
  __m128 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48 [2];
  float afStack_40 [4];
  
  p_Var1 = this->_vptr_BinaryOp_x86[-3];
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var1)) {
  case 0:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar12 = 0;
      do {
        pauVar8 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar10 = 0;
        }
        else {
          iVar9 = 3;
          do {
            auVar16._0_4_ = *(float *)*pauVar8 + fVar15;
            auVar16._4_4_ = *(float *)((long)*pauVar8 + 4) + fVar15;
            auVar16._8_4_ = *(float *)((long)*pauVar8 + 8) + fVar15;
            auVar16._12_4_ = *(float *)((long)*pauVar8 + 0xc) + fVar15;
            *pauVar8 = auVar16;
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar5 & 0xfffffffc;
          } while (iVar9 < (int)uVar5);
        }
        if (uVar5 - uVar10 != 0 && (int)uVar10 <= (int)uVar5) {
          lVar11 = 0;
          do {
            *(float *)((long)*pauVar8 + lVar11 * 4) =
                 *(float *)((long)*pauVar8 + lVar11 * 4) + fVar15;
            lVar11 = lVar11 + 1;
          } while (uVar5 - uVar10 != (int)lVar11);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar7);
    }
    break;
  case 1:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar12 = 0;
      do {
        pauVar8 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar10 = 0;
        }
        else {
          iVar9 = 3;
          do {
            auVar19._0_4_ = *(float *)*pauVar8 - fVar15;
            auVar19._4_4_ = *(float *)((long)*pauVar8 + 4) - fVar15;
            auVar19._8_4_ = *(float *)((long)*pauVar8 + 8) - fVar15;
            auVar19._12_4_ = *(float *)((long)*pauVar8 + 0xc) - fVar15;
            *pauVar8 = auVar19;
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar5 & 0xfffffffc;
          } while (iVar9 < (int)uVar5);
        }
        if (uVar5 - uVar10 != 0 && (int)uVar10 <= (int)uVar5) {
          lVar11 = 0;
          do {
            *(float *)((long)*pauVar8 + lVar11 * 4) =
                 *(float *)((long)*pauVar8 + lVar11 * 4) - fVar15;
            lVar11 = lVar11 + 1;
          } while (uVar5 - uVar10 != (int)lVar11);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar7);
    }
    break;
  case 2:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar12 = 0;
      do {
        pauVar8 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar10 = 0;
        }
        else {
          iVar9 = 3;
          do {
            auVar17._0_4_ = *(float *)*pauVar8 * fVar15;
            auVar17._4_4_ = *(float *)((long)*pauVar8 + 4) * fVar15;
            auVar17._8_4_ = *(float *)((long)*pauVar8 + 8) * fVar15;
            auVar17._12_4_ = *(float *)((long)*pauVar8 + 0xc) * fVar15;
            *pauVar8 = auVar17;
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar5 & 0xfffffffc;
          } while (iVar9 < (int)uVar5);
        }
        if (uVar5 - uVar10 != 0 && (int)uVar10 <= (int)uVar5) {
          lVar11 = 0;
          do {
            *(float *)((long)*pauVar8 + lVar11 * 4) =
                 *(float *)((long)*pauVar8 + lVar11 * 4) * fVar15;
            lVar11 = lVar11 + 1;
          } while (uVar5 - uVar10 != (int)lVar11);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar7);
    }
    break;
  case 3:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      fVar15 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var1);
      lVar12 = 0;
      do {
        pauVar8 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar10 = 0;
        }
        else {
          iVar9 = 3;
          do {
            auVar18._0_4_ = *(float *)*pauVar8 * fVar15;
            auVar18._4_4_ = *(float *)((long)*pauVar8 + 4) * fVar15;
            auVar18._8_4_ = *(float *)((long)*pauVar8 + 8) * fVar15;
            auVar18._12_4_ = *(float *)((long)*pauVar8 + 0xc) * fVar15;
            *pauVar8 = auVar18;
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar5 & 0xfffffffc;
          } while (iVar9 < (int)uVar5);
        }
        if (uVar5 - uVar10 != 0 && (int)uVar10 <= (int)uVar5) {
          lVar11 = 0;
          do {
            *(float *)((long)*pauVar8 + lVar11 * 4) =
                 *(float *)((long)*pauVar8 + lVar11 * 4) * fVar15;
            lVar11 = lVar11 + 1;
          } while (uVar5 - uVar10 != (int)lVar11);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar7);
    }
    break;
  case 4:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar12 = 0;
      do {
        pauVar8 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar10 = 0;
        }
        else {
          iVar9 = 3;
          do {
            auVar4._4_4_ = fVar15;
            auVar4._0_4_ = fVar15;
            auVar4._8_4_ = fVar15;
            auVar4._12_4_ = fVar15;
            auVar20 = maxps(*pauVar8,auVar4);
            *pauVar8 = auVar20;
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar5 & 0xfffffffc;
          } while (iVar9 < (int)uVar5);
        }
        if (uVar5 - uVar10 != 0 && (int)uVar10 <= (int)uVar5) {
          lVar11 = 0;
          do {
            fVar21 = *(float *)(*pauVar8 + lVar11 * 4);
            if (*(float *)(*pauVar8 + lVar11 * 4) <= fVar15) {
              fVar21 = fVar15;
            }
            *(float *)(*pauVar8 + lVar11 * 4) = fVar21;
            lVar11 = lVar11 + 1;
          } while (uVar5 - uVar10 != (int)lVar11);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar7);
    }
    break;
  case 5:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar12 = 0;
      do {
        pauVar8 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar10 = 0;
        }
        else {
          iVar9 = 3;
          do {
            auVar3._4_4_ = fVar15;
            auVar3._0_4_ = fVar15;
            auVar3._8_4_ = fVar15;
            auVar3._12_4_ = fVar15;
            auVar20 = minps(*pauVar8,auVar3);
            *pauVar8 = auVar20;
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar5 & 0xfffffffc;
          } while (iVar9 < (int)uVar5);
        }
        if (uVar5 - uVar10 != 0 && (int)uVar10 <= (int)uVar5) {
          lVar11 = 0;
          do {
            fVar21 = *(float *)(*pauVar8 + lVar11 * 4);
            if (fVar15 <= *(float *)(*pauVar8 + lVar11 * 4)) {
              fVar21 = fVar15;
            }
            *(float *)(*pauVar8 + lVar11 * 4) = fVar21;
            lVar11 = lVar11 + 1;
          } while (uVar5 - uVar10 != (int)lVar11);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar7);
    }
    break;
  case 6:
    local_88 = (long)bottom_top_blob->c;
    if (0 < local_88) {
      local_68 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_80 = 0;
      local_58 = ZEXT416((uint)local_68);
      local_90 = bottom_top_blob;
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      do {
        pafVar6 = (__m128 *)(local_90->cstep * local_80 * local_90->elemsize + (long)local_90->data)
        ;
        local_48[1] = fStack_64;
        local_48[0] = local_68;
        afStack_40[1] = fStack_5c;
        afStack_40[0] = fStack_60;
        if (iVar7 < 4) {
          iVar9 = 0;
        }
        else {
          iVar13 = 0;
          do {
            local_78 = *pafVar6;
            afVar25 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                (&local_91,&local_78,(__m128 *)local_48);
            uVar2 = afVar25._0_8_;
            local_78[2] = (float)extraout_XMM0_Dc;
            local_78[0] = (float)(int)uVar2;
            local_78[1] = (float)(int)((ulong)uVar2 >> 0x20);
            local_78[3] = extraout_XMM0_Dd;
            afVar25[2] = (float)extraout_XMM0_Dc;
            afVar25[0] = (float)(int)uVar2;
            afVar25[1] = (float)(int)((ulong)uVar2 >> 0x20);
            afVar25[3] = extraout_XMM0_Dd;
            *pafVar6 = afVar25;
            pafVar6 = pafVar6 + 1;
            iVar9 = iVar13 + 4;
            iVar14 = iVar13 + 7;
            iVar13 = iVar9;
          } while (iVar14 < iVar7);
        }
        if (iVar7 - iVar9 != 0 && iVar9 <= iVar7) {
          lVar12 = 0;
          do {
            fVar15 = powf((*pafVar6)[lVar12],(float)local_58._0_4_);
            (*pafVar6)[lVar12] = fVar15;
            lVar12 = lVar12 + 1;
          } while (iVar7 - iVar9 != (int)lVar12);
        }
        local_80 = local_80 + 1;
      } while (local_80 != local_88);
    }
    break;
  case 7:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar12 = 0;
      do {
        pauVar8 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar10 = 0;
        }
        else {
          iVar9 = 3;
          do {
            auVar20._0_4_ = fVar15 - *(float *)*pauVar8;
            auVar20._4_4_ = fVar15 - *(float *)((long)*pauVar8 + 4);
            auVar20._8_4_ = fVar15 - *(float *)((long)*pauVar8 + 8);
            auVar20._12_4_ = fVar15 - *(float *)((long)*pauVar8 + 0xc);
            *pauVar8 = auVar20;
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar5 & 0xfffffffc;
          } while (iVar9 < (int)uVar5);
        }
        if (uVar5 - uVar10 != 0 && (int)uVar10 <= (int)uVar5) {
          lVar11 = 0;
          do {
            *(float *)((long)*pauVar8 + lVar11 * 4) =
                 fVar15 - *(float *)((long)*pauVar8 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (uVar5 - uVar10 != (int)lVar11);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar7);
    }
    break;
  case 8:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar12 = 0;
      do {
        pauVar8 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar10 = 0;
        }
        else {
          iVar9 = 3;
          do {
            auVar20 = *pauVar8;
            in_XMM3 = rcpps(in_XMM3,auVar20);
            fVar21 = fVar15 * in_XMM3._0_4_;
            fVar22 = fVar15 * in_XMM3._4_4_;
            fVar23 = fVar15 * in_XMM3._8_4_;
            fVar24 = fVar15 * in_XMM3._12_4_;
            *(float *)*pauVar8 = (fVar15 - auVar20._0_4_ * fVar21) * in_XMM3._0_4_ + fVar21;
            *(float *)(*pauVar8 + 4) = (fVar15 - auVar20._4_4_ * fVar22) * in_XMM3._4_4_ + fVar22;
            *(float *)(*pauVar8 + 8) = (fVar15 - auVar20._8_4_ * fVar23) * in_XMM3._8_4_ + fVar23;
            *(float *)(*pauVar8 + 0xc) =
                 (fVar15 - auVar20._12_4_ * fVar24) * in_XMM3._12_4_ + fVar24;
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar5 & 0xfffffffc;
          } while (iVar9 < (int)uVar5);
        }
        if (uVar5 - uVar10 != 0 && (int)uVar10 <= (int)uVar5) {
          lVar11 = 0;
          do {
            *(float *)(*pauVar8 + lVar11 * 4) = fVar15 / *(float *)(*pauVar8 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (uVar5 - uVar10 != (int)lVar11);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar7);
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_functor;

    if (op_type == Operation_ADD)
        return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);

    if (op_type == Operation_SUB)
        return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);

    if (op_type == Operation_MUL)
        return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);

    if (op_type == Operation_DIV)
        return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);

    if (op_type == Operation_MAX)
        return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);

    if (op_type == Operation_MIN)
        return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);

    if (op_type == Operation_POW)
        return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);

    if (op_type == Operation_RSUB)
        return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);

    if (op_type == Operation_RDIV)
        return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);

    return 0;
}